

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

double sexp_ratio_to_double(sexp ctx,sexp rat)

{
  sexp a;
  sexp psVar1;
  double dVar2;
  double dVar3;
  sexp quot;
  sexp local_38;
  double local_30;
  sexp_gc_var_t local_28;
  
  local_38 = (sexp)0x43e;
  psVar1 = (rat->value).type.name;
  a = (rat->value).type.cpl;
  if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0xc)) {
    dVar2 = sexp_bignum_to_double(psVar1);
  }
  else {
    dVar2 = (double)((long)psVar1 >> 1);
  }
  if ((((ulong)a & 3) == 0) && (a->tag == 0xc)) {
    local_30 = dVar2;
    dVar3 = sexp_bignum_to_double(a);
    dVar2 = local_30;
  }
  else {
    dVar3 = (double)((long)a >> 1);
  }
  dVar2 = dVar2 / dVar3;
  if (0x7fefffffffffffff < (long)ABS(dVar2)) {
    local_28.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_28;
    local_28.var = &local_38;
    psVar1 = sexp_compare(ctx,(rat->value).type.name,(rat->value).type.cpl);
    if ((long)psVar1 < 0) {
      local_38 = sexp_quotient(ctx,(rat->value).type.cpl,(rat->value).type.name);
      dVar2 = sexp_to_double(ctx,local_38);
      dVar2 = 1.0 / dVar2;
    }
    else {
      local_38 = sexp_quotient(ctx,(rat->value).type.name,(rat->value).type.cpl);
      dVar2 = sexp_to_double(ctx,local_38);
    }
    (ctx->value).context.saves = local_28.next;
  }
  return dVar2;
}

Assistant:

double sexp_ratio_to_double (sexp ctx, sexp rat) {
  sexp_gc_var1(quot);
  sexp num = sexp_ratio_numerator(rat), den = sexp_ratio_denominator(rat);
  double res = (sexp_bignump(num) ? sexp_bignum_to_double(num)
          : sexp_fixnum_to_double(num))
    / (sexp_bignump(den) ? sexp_bignum_to_double(den)
       : sexp_fixnum_to_double(den));
  if (!isfinite(res)) {
    sexp_gc_preserve1(ctx, quot);
    if (sexp_unbox_fixnum(sexp_compare(ctx, sexp_ratio_numerator(rat),  sexp_ratio_denominator(rat))) < 0) {
      quot = sexp_quotient(ctx, sexp_ratio_denominator(rat),  sexp_ratio_numerator(rat));
      res = 1 / sexp_to_double(ctx, quot);
    } else {
      quot = sexp_quotient(ctx, sexp_ratio_numerator(rat),  sexp_ratio_denominator(rat));
      res = sexp_to_double(ctx, quot);
    }
    sexp_gc_release1(ctx);
  }
  return res;
}